

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  Chunk CVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  
  Align(this,other);
  iVar10 = (int)this->used_bigits_;
  uVar2 = (uint)this->exponent_;
  sVar1 = other->used_bigits_;
  iVar3 = (int)other->exponent_;
  iVar5 = iVar3 + sVar1;
  if (iVar5 < (int)(uVar2 + iVar10)) {
    iVar5 = uVar2 + iVar10;
  }
  if (0x7f < (int)(iVar5 - uVar2)) {
    abort();
  }
  lVar9 = (long)iVar10;
  uVar7 = iVar3 - uVar2;
  uVar8 = (ulong)uVar7;
  if (iVar10 < (int)uVar7) {
    memset(this->bigits_buffer_ + lVar9,0,(ulong)((~uVar2 + iVar3) - iVar10) * 4 + 4);
  }
  if (0 < sVar1) {
    uVar8 = (ulong)(int)uVar7;
    uVar4 = 0;
    uVar2 = 0;
    do {
      CVar6 = 0;
      if ((long)uVar8 < lVar9) {
        CVar6 = this->bigits_buffer_[uVar8];
      }
      uVar7 = CVar6 + uVar2 + other->bigits_buffer_[uVar4];
      this->bigits_buffer_[uVar8] = uVar7 & 0xfffffff;
      uVar2 = uVar7 >> 0x1c;
      uVar8 = uVar8 + 1;
      uVar4 = uVar4 + 1;
    } while ((uint)(int)sVar1 != uVar4);
    while (0xfffffff < uVar7) {
      CVar6 = 0;
      if ((long)uVar8 < lVar9) {
        CVar6 = this->bigits_buffer_[uVar8];
      }
      uVar7 = CVar6 + uVar2;
      this->bigits_buffer_[uVar8] = uVar7 & 0xfffffff;
      uVar2 = uVar7 >> 0x1c;
      uVar8 = uVar8 + 1;
    }
  }
  if (iVar10 < (int)uVar8) {
    iVar10 = (int)uVar8;
  }
  this->used_bigits_ = (int16_t)iVar10;
  return;
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + (std::max)(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  DOUBLE_CONVERSION_ASSERT(bigit_pos >= 0);
  for (int i = used_bigits_; i < bigit_pos; ++i) {
    RawBigit(i) = 0;
  }
  for (int i = 0; i < other.used_bigits_; ++i) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + other.RawBigit(i) + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  while (carry != 0) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  used_bigits_ = static_cast<int16_t>(std::max(bigit_pos, static_cast<int>(used_bigits_)));
  DOUBLE_CONVERSION_ASSERT(IsClamped());
}